

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O3

int Ivy_ManCheckChoices(Ivy_Man_t *p)

{
  uint *puVar1;
  Ivy_Man_t *pIVar2;
  Vec_Ptr_t *pVVar3;
  uint *puVar4;
  long lVar5;
  
  pIVar2 = p->pHaig;
  pVVar3 = pIVar2->vObjs;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      puVar1 = (uint *)pVVar3->pArray[lVar5];
      if ((puVar1 != (uint *)0x0) && (puVar1[3] != 0)) {
        puVar4 = *(uint **)(puVar1 + 0x12);
        if (((ulong)puVar4 & 1) != 0) {
          __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCheck.c"
                        ,0x108,"int Ivy_ManCheckChoices(Ivy_Man_t *)");
        }
        if (puVar4 != puVar1 && puVar4 != (uint *)0x0) {
          do {
            if (1 < (int)puVar4[3]) {
              printf("Node %d has member %d in its equiv class with %d fanouts.\n",(ulong)*puVar1,
                     (ulong)*puVar4);
            }
            puVar4 = (uint *)(*(ulong *)(puVar4 + 0x12) & 0xfffffffffffffffe);
          } while ((puVar4 != (uint *)0x0) && (puVar1 != puVar4));
          pIVar2 = p->pHaig;
        }
      }
      lVar5 = lVar5 + 1;
      pVVar3 = pIVar2->vObjs;
    } while (lVar5 < pVVar3->nSize);
  }
  return 1;
}

Assistant:

int Ivy_ManCheckChoices( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj, * pTemp;
    int i;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        // count the number of nodes in the loop
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp && pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
            if ( Ivy_ObjRefs(pTemp) > 1 )
                printf( "Node %d has member %d in its equiv class with %d fanouts.\n", pObj->Id, pTemp->Id, Ivy_ObjRefs(pTemp) );
    }
    return 1;
}